

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O3

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f)

{
  uint uVar1;
  undefined8 *puVar2;
  rt_variable_t *prVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  rt_variable_getter p_Var10;
  rt_variable_setter p_Var11;
  code *pcVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  rt_list_t rVar17;
  
  if ((f->num_of_inputs & 0xfffffffeU) != 2) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }
  puVar2 = (undefined8 *)f->local_context;
  plVar9 = (long *)(*rt_malloc_func)(0xa0);
  if (plVar9 == (long *)0x0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  *puVar2 = plVar9;
  prVar3 = *f->inputs;
  *plVar9 = (long)prVar3;
  p_Var10 = select_getter(prVar3);
  plVar9[1] = (long)p_Var10;
  prVar3 = f->inputs[1];
  plVar9[2] = (long)prVar3;
  p_Var10 = select_getter(prVar3);
  plVar9[3] = (long)p_Var10;
  prVar3 = *f->outputs;
  plVar9[6] = (long)prVar3;
  p_Var10 = select_getter(prVar3);
  plVar9[8] = (long)p_Var10;
  p_Var11 = select_setter((rt_variable_t *)plVar9[6]);
  plVar9[7] = (long)p_Var11;
  if (f->num_of_inputs < 3) {
    lVar13 = 0x20;
    p_Var10 = (rt_variable_getter)0x0;
  }
  else {
    prVar3 = f->inputs[2];
    plVar9[4] = (long)prVar3;
    p_Var10 = select_getter(prVar3);
    lVar13 = 0x28;
  }
  *(rt_variable_getter *)((long)plVar9 + lVar13) = p_Var10;
  *(undefined4 *)((long)plVar9 + 0x9c) = 1;
  uVar1 = *(uint *)(puVar2 + 1);
  if (0 < (long)(int)uVar1) {
    lVar13 = *(long *)((int *)*plVar9 + 2);
    iVar14 = 1;
    lVar15 = 0;
    do {
      iVar14 = iVar14 * *(int *)(lVar13 + lVar15 * 4);
      *(int *)((long)plVar9 + 0x9c) = iVar14;
      lVar15 = lVar15 + 1;
    } while ((int)uVar1 != lVar15);
  }
  iVar14 = ~uVar1 + *(int *)*plVar9;
  *(int *)(plVar9 + 0x13) = iVar14;
  rVar17 = allocate_list(iVar14);
  *(int *)(plVar9 + 9) = rVar17.size;
  plVar9[10] = (long)rVar17.data;
  rVar17 = allocate_list((int)plVar9[0x13]);
  *(int *)(plVar9 + 0xd) = rVar17.size;
  plVar9[0xe] = (long)rVar17.data;
  rVar17 = allocate_list((int)plVar9[0x13]);
  *(int *)(plVar9 + 0xb) = rVar17.size;
  plVar9[0xc] = (long)rVar17.data;
  rVar17 = allocate_list((int)plVar9[0x13]);
  *(int *)(plVar9 + 0xf) = rVar17.size;
  plVar9[0x10] = (long)rVar17.data;
  rVar17 = allocate_list((int)plVar9[0x13]);
  *(int *)(plVar9 + 0x11) = rVar17.size;
  plVar9[0x12] = (long)rVar17.data;
  lVar13 = *plVar9;
  if (0 < (int)plVar9[0x13]) {
    lVar15 = *(long *)(plVar9[2] + 8);
    lVar4 = plVar9[0xe];
    lVar5 = *(long *)(lVar13 + 8);
    lVar6 = plVar9[10];
    lVar7 = *(long *)(plVar9[6] + 8);
    lVar8 = plVar9[0xc];
    lVar16 = 0;
    do {
      *(undefined4 *)(lVar4 + lVar16 * 4) = *(undefined4 *)(lVar15 + 8 + lVar16 * 4);
      *(undefined4 *)(lVar6 + lVar16 * 4) =
           *(undefined4 *)(lVar5 + 4 + (*(int *)(puVar2 + 1) + lVar16) * 4);
      *(undefined4 *)(lVar8 + lVar16 * 4) =
           *(undefined4 *)(lVar7 + 4 + (*(int *)(puVar2 + 1) + lVar16) * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)plVar9[0x13]);
  }
  if ((((*(byte *)(lVar13 + 0x10) & 0xf) == 0) && ((*(byte *)(plVar9[6] + 0x10) & 0xf) == 0)) &&
     ((*(byte *)(plVar9[2] + 0x10) & 0xf) == 0)) {
    pcVar12 = exec_deconvolution;
    if ((plVar9[4] == 0) || ((*(byte *)(plVar9[4] + 0x10) & 0xf) == 0)) goto LAB_0011cbd5;
  }
  pcVar12 = exec_deconvolution_generic;
LAB_0011cbd5:
  f->exec_func = pcVar12;
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);

  if (f->num_of_inputs != 2 && f->num_of_inputs != 3) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }

  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  deconvolution_private_t *p = rt_malloc_func(sizeof(deconvolution_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  c->data = (void *)p;
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);

  p->weight = f->inputs[1];
  p->get_weight = select_getter(p->weight);

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);

  if (f->num_of_inputs > 2) {
    p->bias = f->inputs[2];
    p->get_bias = select_getter(p->bias);
  } else {
    p->bias = 0;
  }

  p->base_loop_size = 1;
  for (int i = 0; i < c->base_axis; i++) {
    p->base_loop_size *= p->input->shape.data[i];
  }
  p->spatial_dims = p->input->shape.size - c->base_axis - 1;

  p->input_shape = allocate_list(p->spatial_dims);
  p->kernel_shape = allocate_list(p->spatial_dims);
  p->output_shape = allocate_list(p->spatial_dims);
  p->in_position = allocate_list(p->spatial_dims);
  p->out_position = allocate_list(p->spatial_dims);

  for (int i = 0; i < p->spatial_dims; i++) {
    p->kernel_shape.data[i] = p->weight->shape.data[i + 2];
    p->input_shape.data[i] = p->input->shape.data[i + c->base_axis + 1];
    p->output_shape.data[i] = p->output->shape.data[i + c->base_axis + 1];
  }

  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT &&
      p->weight->type == NN_DATA_TYPE_FLOAT &&
      ((p->bias && p->bias->type == NN_DATA_TYPE_FLOAT) || !p->bias)) {
#ifdef CONFIG_DECONVOLUTION_FLOAT32
    f->exec_func = exec_deconvolution;
#endif /* CONFIG_DECONVOLUTION_FLOAT32 */
  } else {
#ifdef CONFIG_DECONVOLUTION_GENERIC
    f->exec_func = exec_deconvolution_generic;
#endif /* CONFIG_DECONVOLUTION_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}